

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_hor_2tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  __m128i res;
  __m128i res_00;
  int in_ECX;
  int in_EDX;
  __m256i coeffs_256;
  __m128i r_2 [2];
  __m128i r_1;
  __m128i r;
  __m128i coeffs_128;
  int16_t *im;
  int32_t y;
  uint8_t *src_ptr;
  int16_t *in_stack_fffffffffffffef0;
  int16_t *in_stack_fffffffffffffef8;
  __m128i *in_stack_ffffffffffffff00;
  int32_t in_stack_ffffffffffffff0c;
  InterpFilterParams *in_stack_ffffffffffffff10;
  __m128i *in_stack_ffffffffffffff20;
  ptrdiff_t in_stack_ffffffffffffff28;
  __m256i *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff3c;
  InterpFilterParams *in_stack_ffffffffffffff40;
  ptrdiff_t in_stack_ffffffffffffff48;
  uint8_t *in_stack_ffffffffffffff50;
  __m256i *in_stack_ffffffffffffff58;
  __m256i *in_stack_ffffffffffffff60;
  __m256i *in_stack_ffffffffffffff68;
  __m256i *in_stack_ffffffffffffff70;
  undefined4 local_64;
  
  local_64 = in_ECX;
  if (in_EDX < 9) {
    prepare_half_coeffs_2tap_ssse3
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
    if (in_EDX == 2) {
      do {
        x_convolve_2tap_2x2_sse4_1
                  ((uint8_t *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20);
        res[1] = (longlong)in_stack_ffffffffffffff00;
        res[0] = (longlong)in_stack_fffffffffffffef8;
        xy_x_round_store_2x2_sse2(res,in_stack_fffffffffffffef0);
        local_64 = local_64 + -2;
      } while (local_64 != 0);
    }
    else if (in_EDX == 4) {
      do {
        x_convolve_2tap_4x2_ssse3
                  ((uint8_t *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20);
        res_00[1] = (longlong)in_stack_ffffffffffffff00;
        res_00[0] = (longlong)in_stack_fffffffffffffef8;
        xy_x_round_store_4x2_sse2(res_00,in_stack_fffffffffffffef0);
        local_64 = local_64 + -2;
      } while (local_64 != 0);
    }
    else {
      do {
        x_convolve_2tap_8x2_ssse3
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (__m128i *)in_stack_ffffffffffffff40,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        xy_x_round_store_8x2_sse2(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_64 = local_64 + -2;
      } while (local_64 != 0);
    }
  }
  else {
    prepare_half_coeffs_2tap_avx2
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
    if (in_EDX == 0x10) {
      do {
        x_convolve_2tap_16x2_avx2
                  ((uint8_t *)in_stack_ffffffffffffff70,(ptrdiff_t)in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        xy_x_round_store_32_avx2(in_stack_ffffffffffffff70,(int16_t *)in_stack_ffffffffffffff68);
        local_64 = local_64 + -2;
      } while (local_64 != 0);
    }
    else if (in_EDX == 0x20) {
      do {
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        local_64 = local_64 + -1;
      } while (local_64 != 0);
    }
    else if (in_EDX == 0x40) {
      do {
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        local_64 = local_64 + -1;
      } while (local_64 != 0);
    }
    else {
      do {
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        xy_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (int16_t *)in_stack_ffffffffffffff60);
        local_64 = local_64 + -1;
      } while (local_64 != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_2tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 8) {
    __m128i coeffs_128;

    prepare_half_coeffs_2tap_ssse3(filter_params_x, subpel_x_q4, &coeffs_128);

    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_2tap_2x2_sse4_1(src_ptr, src_stride, &coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_2tap_4x2_ssse3(src_ptr, src_stride, &coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    } else {
      assert(w == 8);

      do {
        __m128i r[2];

        x_convolve_2tap_8x2_ssse3(src_ptr, src_stride, &coeffs_128, r);
        xy_x_round_store_8x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256;

    prepare_half_coeffs_2tap_avx2(filter_params_x, subpel_x_q4, &coeffs_256);

    if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_2tap_16x2_avx2(src_ptr, src_stride, &coeffs_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_2tap_32_avx2(src_ptr, &coeffs_256, im);
        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_2tap_32_avx2(src_ptr + 0 * 32, &coeffs_256, im + 0 * 32);
        xy_x_2tap_32_avx2(src_ptr + 1 * 32, &coeffs_256, im + 1 * 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_2tap_32_avx2(src_ptr + 0 * 32, &coeffs_256, im + 0 * 32);
        xy_x_2tap_32_avx2(src_ptr + 1 * 32, &coeffs_256, im + 1 * 32);
        xy_x_2tap_32_avx2(src_ptr + 2 * 32, &coeffs_256, im + 2 * 32);
        xy_x_2tap_32_avx2(src_ptr + 3 * 32, &coeffs_256, im + 3 * 32);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}